

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O2

void __thiscall
BufferPool_FreeBuffersAndBackingMemory_Test::TestBody
          (BufferPool_FreeBuffersAndBackingMemory_Test *this)

{
  FreeNode *node;
  FreeNode *pFVar1;
  long lVar2;
  size_t j;
  long lVar3;
  bool bVar4;
  BufferPool pool;
  
  memt::BufferPool::BufferPool(&pool,5);
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    memt::BufferPool::freeAllBuffersAndBackingMemory(&pool);
    lVar2 = 100;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      pFVar1 = (FreeNode *)memt::BufferPool::alloc(&pool);
      pFVar1->next = pool._free;
      pool._free = pFVar1;
      memt::BufferPool::alloc(&pool);
    }
    memt::BufferPool::freeAllBuffersAndBackingMemory(&pool);
  }
  memt::MemoryBlocks::~MemoryBlocks(&pool._blocks);
  return;
}

Assistant:

TEST(BufferPool, FreeBuffersAndBackingMemory) {
  memt::BufferPool pool(5);
  for (size_t j = 0; j < 2; ++j) {
    pool.freeAllBuffersAndBackingMemory();
    for (size_t i = 0; i < 100; ++i) {
      pool.free(pool.alloc());
      pool.alloc();
    }
    pool.freeAllBuffersAndBackingMemory();
  }
}